

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment.hpp
# Opt level: O1

size_t pstore::repo::fragment::size_bytes<pstore::repo::bss_section_creation_dispatcher*>
                 (bss_section_creation_dispatcher *first,bss_section_creation_dispatcher *last)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar3;
  long lVar4;
  
  check_range_is_sorted<pstore::repo::bss_section_creation_dispatcher*>(first,last);
  if (-0x18 < (long)last - (long)first) {
    lVar4 = ((long)last - (long)first >> 3) * -0x5555555555555555;
    sVar3 = (lVar4 + (ulong)(lVar4 == 0)) * 8 + 0x18;
    for (; first != last; first = first + 1) {
      iVar1 = (*(first->super_section_creation_dispatcher)._vptr_section_creation_dispatcher[4])
                        (first,sVar3);
      iVar2 = (*(first->super_section_creation_dispatcher)._vptr_section_creation_dispatcher[2])
                        (first);
      sVar3 = CONCAT44(extraout_var_00,iVar2) + CONCAT44(extraout_var,iVar1);
    }
    return sVar3;
  }
  assert_failed("num_contents >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/mcrepo/fragment.hpp"
                ,0x1cd);
}

Assistant:

std::size_t fragment::size_bytes (Iterator first, Iterator last) {
            fragment::check_range_is_sorted (first, last);

            auto const num_contents = std::distance (first, last);
            PSTORE_ASSERT (num_contents >= 0);
            auto const unum_contents =
                static_cast<typename std::make_unsigned<decltype (num_contents)>::type> (
                    num_contents);

            // Space needed by the signature and section offset array.
            std::size_t size_bytes =
                offsetof (fragment, arr_) + decltype (fragment::arr_)::size_bytes (unum_contents);
            // Now the storage for each of the contents
            std::for_each (first, last, [&size_bytes] (section_creation_dispatcher const & c) {
                size_bytes = c.aligned (size_bytes);
                size_bytes += c.size_bytes ();
            });
            return size_bytes;
        }